

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

bool loguru::remove_callback(char *id)

{
  Callback *pCVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
  __it;
  long lVar4;
  long lVar5;
  __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
  __position;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double __x;
  char **local_40;
  char *id_local;
  
  id_local = id;
  std::recursive_mutex::lock((recursive_mutex *)s_mutex);
  pCVar1 = DAT_0013eb40;
  lVar4 = (long)DAT_0013eb40 - (long)s_callbacks;
  __it._M_current = s_callbacks;
  __x = extraout_XMM0_Qa;
  local_40 = &id_local;
  for (lVar5 = lVar4 / 0x50 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<loguru::remove_callback(char_const*)::$_0>::operator()
                      ((_Iter_pred<loguru::remove_callback(char_const*)::__0> *)&local_40,__it);
    __position._M_current = __it._M_current;
    __x = extraout_XMM0_Qa_00;
    if (bVar2) goto LAB_00123b25;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<loguru::remove_callback(char_const*)::$_0>::operator()
                      ((_Iter_pred<loguru::remove_callback(char_const*)::__0> *)&local_40,
                       __it._M_current + 1);
    __position._M_current = __it._M_current + 1;
    __x = extraout_XMM0_Qa_01;
    if (bVar2) goto LAB_00123b25;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<loguru::remove_callback(char_const*)::$_0>::operator()
                      ((_Iter_pred<loguru::remove_callback(char_const*)::__0> *)&local_40,
                       __it._M_current + 2);
    __position._M_current = __it._M_current + 2;
    __x = extraout_XMM0_Qa_02;
    if (bVar2) goto LAB_00123b25;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<loguru::remove_callback(char_const*)::$_0>::operator()
                      ((_Iter_pred<loguru::remove_callback(char_const*)::__0> *)&local_40,
                       __it._M_current + 3);
    __position._M_current = __it._M_current + 3;
    __x = extraout_XMM0_Qa_03;
    if (bVar2) goto LAB_00123b25;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x140;
  }
  lVar4 = lVar4 / 0x50;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      __position._M_current = pCVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<loguru::remove_callback(char_const*)::$_0>::
                  operator()((_Iter_pred<loguru::remove_callback(char_const*)::__0> *)&local_40,__it
                            ), __position._M_current = __it._M_current, __x = extraout_XMM0_Qa_04,
         bVar2)) goto LAB_00123b25;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<loguru::remove_callback(char_const*)::$_0>::operator()
                      ((_Iter_pred<loguru::remove_callback(char_const*)::__0> *)&local_40,__it);
    __position._M_current = __it._M_current;
    __x = extraout_XMM0_Qa_05;
    if (bVar2) goto LAB_00123b25;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<loguru::remove_callback(char_const*)::$_0>::operator()
                    ((_Iter_pred<loguru::remove_callback(char_const*)::__0> *)&local_40,__it);
  __position._M_current = pCVar1;
  __x = extraout_XMM0_Qa_06;
  if (bVar2) {
    __position._M_current = __it._M_current;
  }
LAB_00123b25:
  pCVar1 = DAT_0013eb40;
  if (__position._M_current == DAT_0013eb40) {
    iVar3 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar3 = g_stderr_verbosity;
    }
    if (-3 < iVar3) {
      log(__x);
    }
  }
  else {
    if ((__position._M_current)->close != (close_handler_t)0x0) {
      (*(__position._M_current)->close)((__position._M_current)->user_data);
    }
    std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::erase
              ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)&s_callbacks,
               (const_iterator)__position._M_current);
    on_callback_change();
  }
  pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  return __position._M_current != pCVar1;
}

Assistant:

bool remove_callback(const char* id)
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		auto it = std::find_if(begin(s_callbacks), end(s_callbacks), [&](const Callback& c) { return c.id == id; });
		if (it != s_callbacks.end()) {
			if (it->close) { it->close(it->user_data); }
			s_callbacks.erase(it);
			on_callback_change();
			return true;
		} else {
			LOG_F(ERROR, "Failed to locate callback with id '" LOGURU_FMT(s) "'", id);
			return false;
		}
	}